

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O2

uint64_t __thiscall
FIX::double_conversion::ReadUint64
          (double_conversion *this,Vector<const_char> buffer,int *number_of_read_digits)

{
  byte *pbVar1;
  ulong uVar2;
  char *pcVar3;
  int index;
  Vector<const_char> local_38;
  
  pcVar3 = buffer.start_;
  local_38.length_ = (int)buffer.start_;
  index = 0;
  local_38.start_ = (char *)this;
  for (uVar2 = 0; (index < (int)pcVar3 && (uVar2 < 0x1999999999999999));
      uVar2 = (ulong)(*pbVar1 & 0xf) + uVar2 * 10) {
    pbVar1 = (byte *)Vector<const_char>::operator[](&local_38,index);
    if (9 < (byte)(*pbVar1 - 0x30)) {
      __assert_fail("0 <= digit && digit <= 9",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/strtod.cc"
                    ,0xa4,"uint64_t FIX::double_conversion::ReadUint64(Vector<const char>, int *)");
    }
    index = index + 1;
    pcVar3 = (char *)(ulong)(uint)local_38.length_;
  }
  *buffer._8_8_ = index;
  return uVar2;
}

Assistant:

static uint64_t ReadUint64(Vector<const char> buffer,
                           int* number_of_read_digits) {
  uint64_t result = 0;
  int i = 0;
  while (i < buffer.length() && result <= (kMaxUint64 / 10 - 1)) {
    int digit = buffer[i++] - '0';
    ASSERT(0 <= digit && digit <= 9);
    result = 10 * result + digit;
  }
  *number_of_read_digits = i;
  return result;
}